

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,GroupInfo *_groupInfo)

{
  GroupInfo *_groupInfo_local;
  TestGroupStats *this_local;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_002bbe08;
  GroupInfo::GroupInfo(&this->groupInfo,_groupInfo);
  Totals::Totals(&this->totals);
  this->aborting = false;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo )
    :   groupInfo( _groupInfo ),
        aborting( false )
    {}